

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Read<double> __thiscall
Omega_h::interleave<double>
          (Omega_h *this,
          vector<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *arrays)

{
  int *piVar1;
  pointer pRVar2;
  pointer pRVar3;
  Alloc *pAVar4;
  undefined8 uVar5;
  pointer pRVar6;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int n;
  size_t sVar10;
  Read<double> RVar11;
  Write<double> out;
  type f;
  value_type array;
  Write<double> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [56];
  Alloc *local_40;
  Alloc *local_38;
  
  pRVar2 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar2 == pRVar3) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    pAVar4 = (pRVar2->write_).shared_alloc_.alloc;
    if (((ulong)pAVar4 & 1) == 0) {
      sVar10 = pAVar4->size;
    }
    else {
      sVar10 = (ulong)pAVar4 >> 3;
    }
    n = (int)(sVar10 >> 3);
    for (pRVar6 = pRVar2; local_38 = (Alloc *)arrays, pRVar6 != pRVar3; pRVar6 = pRVar6 + 1) {
      pAVar4 = (pRVar6->write_).shared_alloc_.alloc;
      if (((ulong)pAVar4 & 1) == 0) {
        uVar9 = pAVar4->size;
      }
      else {
        uVar9 = (ulong)pAVar4 >> 3;
      }
      if ((int)(uVar9 >> 3) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
    }
    local_88._0_8_ = (Alloc *)local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
    uVar7 = (uint)((ulong)((long)pRVar3 - (long)pRVar2) >> 4);
    local_40 = (Alloc *)this;
    Write<double>::Write(&local_98,n * uVar7,(string *)local_88);
    if ((Alloc *)local_88._0_8_ != (Alloc *)local_78) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_78._4_4_,local_78._0_4_) + 1);
    }
    if (0 < (int)uVar7) {
      lVar8 = 8;
      uVar9 = 0;
      do {
        pRVar2 = (((_Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *)
                  &local_38->size)->_M_impl).super__Vector_impl_data._M_start;
        local_78._40_8_ = *(ulong *)((long)pRVar2 + lVar8 + -8);
        if ((local_78._40_8_ & 7) == 0 && (Alloc *)local_78._40_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78._40_8_ = ((Alloc *)local_78._40_8_)->size * 8 + 1;
          }
          else {
            ((Alloc *)local_78._40_8_)->use_count = ((Alloc *)local_78._40_8_)->use_count + 1;
          }
        }
        local_78._16_8_ = *(size_type *)((long)&(pRVar2->write_).shared_alloc_.alloc + lVar8);
        local_88._0_8_ = local_98.shared_alloc_.alloc;
        if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
            local_98.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88._0_8_ = (local_98.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_98.shared_alloc_.alloc)->use_count =
                 (local_98.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_88._8_8_ = local_98.shared_alloc_.direct_ptr;
        local_78._4_4_ = (undefined4)uVar9;
        local_78._8_8_ = local_78._40_8_;
        if ((local_78._40_8_ & 7) == 0 && (Alloc *)local_78._40_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78._8_8_ = *(size_t *)local_78._40_8_ * 8 + 1;
          }
          else {
            *(int *)(local_78._40_8_ + 0x30) = *(int *)(local_78._40_8_ + 0x30) + 1;
          }
        }
        local_78._0_4_ = uVar7;
        local_78._48_8_ = local_78._16_8_;
        parallel_for<Omega_h::interleave<double>(std::vector<Omega_h::Read<double>,std::allocator<Omega_h::Read<double>>>)::_lambda(int)_1_>
                  (n,(type *)local_88,"interleave");
        uVar5 = local_78._8_8_;
        if ((local_78._8_8_ & 7) == 0 && (Alloc *)local_78._8_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_78._8_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_78._8_8_);
            operator_delete((void *)uVar5,0x48);
          }
        }
        uVar5 = local_88._0_8_;
        if ((local_88._0_8_ & 7) == 0 && (Alloc *)local_88._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_88._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_88._0_8_);
            operator_delete((void *)uVar5,0x48);
          }
        }
        uVar5 = local_78._40_8_;
        if ((local_78._40_8_ & 7) == 0 && (Alloc *)local_78._40_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_78._40_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_78._40_8_);
            operator_delete((void *)uVar5,0x48);
          }
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while ((uVar7 & 0x7fffffff) != uVar9);
    }
    this = (Omega_h *)local_40;
    local_78._24_8_ = local_98.shared_alloc_.alloc;
    local_78._32_8_ = local_98.shared_alloc_.direct_ptr;
    if ((((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
         local_98.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + -1;
      local_78._24_8_ = (local_98.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_98.shared_alloc_.alloc = (Alloc *)0x0;
    local_98.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)local_40,(Write<double> *)(local_78 + 0x18));
    uVar5 = local_78._24_8_;
    in_RDX = extraout_RDX;
    if ((local_78._24_8_ & 7) == 0 && (Alloc *)local_78._24_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_78._24_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_78._24_8_);
        operator_delete((void *)uVar5,0x48);
        in_RDX = extraout_RDX_00;
      }
    }
    pAVar4 = local_98.shared_alloc_.alloc;
    if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
        local_98.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_98.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        in_RDX = extraout_RDX_01;
      }
    }
  }
  RVar11.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar11.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}